

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::DirectStateAccess::VertexArrays::Utilities::itoa_abi_cxx11_
          (string *__return_storage_ptr__,Utilities *this,GLuint i)

{
  string local_1d0 [32];
  stringstream local_1b0 [8];
  stringstream ss;
  undefined1 local_1a0 [394];
  allocator<char> local_16;
  byte local_15;
  uint local_14;
  string *psStack_10;
  GLuint i_local;
  string *s;
  
  local_14 = (uint)this;
  local_15 = 0;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_16);
  std::allocator<char>::~allocator(&local_16);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::ostream::operator<<(local_1a0,local_14);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  local_15 = 1;
  std::__cxx11::stringstream::~stringstream(local_1b0);
  if ((local_15 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Utilities::itoa(glw::GLuint i)
{
	std::string s = "";

	std::stringstream ss;

	ss << i;

	s = ss.str();

	return s;
}